

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O3

string * __thiscall
google::base::CheckOpMessageBuilder::NewString_abi_cxx11_(CheckOpMessageBuilder *this)

{
  string *psVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this->stream_,")",1);
  psVar1 = (string *)operator_new(0x20);
  std::__cxx11::stringbuf::str();
  return psVar1;
}

Assistant:

string* CheckOpMessageBuilder::NewString() {
  *stream_ << ")";
  return new string(stream_->str());
}